

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

QMatrix * Add_QQ(QMatrix *Q1,QMatrix *Q2)

{
  double dVar1;
  double dVar2;
  ElType **ppEVar3;
  Boolean *pBVar4;
  QMatrixType *pQVar5;
  LASErrIdType LVar6;
  char *pcVar7;
  char *pcVar8;
  QMatrix *Q;
  size_t sVar9;
  size_t sVar10;
  char *Object2Name;
  
  Q_Lock(Q1);
  Q_Lock(Q2);
  LVar6 = LASResult();
  if (LVar6 == LASOK) {
    if (Q1->Dim == Q2->Dim) {
      if ((((Q1->Symmetry == Q2->Symmetry) && (Q1->ElOrder == Q2->ElOrder)) && (Q1->Len == Q2->Len))
         && (Q1->El == Q2->El)) {
        Q = (QMatrix *)malloc(0xb0);
        pcVar7 = Q_GetName(Q1);
        sVar9 = strlen(pcVar7);
        pcVar7 = Q_GetName(Q1);
        sVar10 = strlen(pcVar7);
        pcVar7 = (char *)malloc(sVar9 + sVar10 + 10);
        pcVar8 = Q_GetName(Q1);
        Object2Name = Q_GetName(Q2);
        if ((Q == (QMatrix *)0x0) || (pcVar7 == (char *)0x0)) {
          LASError(LASMemAllocErr,"Add_QQ",pcVar8,Object2Name,(char *)0x0);
          if (Q != (QMatrix *)0x0) {
            free(Q);
          }
          if (pcVar7 == (char *)0x0) goto LAB_0010b129;
        }
        else {
          sprintf(pcVar7,"%s + %s",pcVar8,Object2Name);
          Q_Constr(Q,pcVar7,Q1->Dim,Q1->Symmetry,Q1->ElOrder,Tempor,False);
          LVar6 = LASResult();
          if (LVar6 == LASOK) {
            dVar1 = Q1->MultiplU;
            dVar2 = Q2->MultiplU;
            Q->MultiplD = Q2->MultiplD + Q1->MultiplD;
            Q->MultiplU = dVar2 + dVar1;
            Q->MultiplL = Q1->MultiplL + Q2->MultiplL;
            ppEVar3 = Q1->El;
            Q->Len = Q1->Len;
            Q->El = ppEVar3;
            pBVar4 = Q1->DiagElAlloc;
            Q->ElSorted = Q1->ElSorted;
            Q->DiagElAlloc = pBVar4;
            pBVar4 = Q1->ZeroInDiag;
            Q->DiagEl = Q1->DiagEl;
            Q->ZeroInDiag = pBVar4;
            Q->InvDiagEl = Q1->InvDiagEl;
            Q->UnitRightKer = Q1->UnitRightKer;
            Q->RightKerCmp = Q1->RightKerCmp;
            Q->UnitLeftKer = Q1->UnitLeftKer;
            Q->LeftKerCmp = Q1->LeftKerCmp;
            pQVar5 = Q1->ILU;
            Q->ILUExists = Q1->ILUExists;
            Q->ILU = pQVar5;
          }
        }
        free(pcVar7);
        goto LAB_0010b129;
      }
      pcVar7 = Q_GetName(Q1);
      pcVar8 = Q_GetName(Q2);
      LVar6 = LASMatrCombErr;
    }
    else {
      pcVar7 = Q_GetName(Q1);
      pcVar8 = Q_GetName(Q2);
      LVar6 = LASDimErr;
    }
    Q = (QMatrix *)0x0;
    LASError(LVar6,"Add_QQ",pcVar7,pcVar8,(char *)0x0);
  }
  else {
    Q = (QMatrix *)0x0;
  }
LAB_0010b129:
  Q_Unlock(Q1);
  Q_Unlock(Q2);
  return Q;
}

Assistant:

QMatrix *Add_QQ(QMatrix *Q1, QMatrix *Q2)
/* QRes = Q1 + Q2, this operation is limited to matrices, which are
   derived from the same matrix */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q1);
    Q_Lock(Q2);
    
    if (LASResult() == LASOK) {
        if (Q1->Dim == Q2->Dim) {
            if (Q1->Symmetry == Q2->Symmetry &&
                Q1->ElOrder == Q2->ElOrder &&
                Q1->Len == Q2->Len &&
                Q1->El == Q2->El) {
                QRes = (QMatrix *)malloc(sizeof(QMatrix));
                QResName = (char *)malloc((strlen(Q_GetName(Q1)) + strlen(Q_GetName(Q1)) + 10)
                           * sizeof(char));
                if (QRes != NULL && QResName != NULL) {
                    sprintf(QResName, "%s + %s", Q_GetName(Q1), Q_GetName(Q2));
                    Q_Constr(QRes, QResName, Q1->Dim, Q1->Symmetry, Q1->ElOrder, Tempor, False);
                    if (LASResult() == LASOK) {
                        QRes->MultiplD = Q1->MultiplD + Q2->MultiplD;
                        QRes->MultiplU = Q1->MultiplU + Q2->MultiplU;
                        QRes->MultiplL = Q1->MultiplL + Q2->MultiplL;
                        QRes->Len = Q1->Len;
                        QRes->El = Q1->El;
                        QRes->ElSorted = Q1->ElSorted;
                        QRes->DiagElAlloc = Q1->DiagElAlloc;
                        QRes->DiagEl = Q1->DiagEl;
                        QRes->ZeroInDiag = Q1->ZeroInDiag;
                        QRes->InvDiagEl = Q1->InvDiagEl;
                        QRes->UnitRightKer = Q1->UnitRightKer;
                        QRes->RightKerCmp = Q1->RightKerCmp;
                        QRes->UnitLeftKer = Q1->UnitLeftKer;
                        QRes->LeftKerCmp = Q1->LeftKerCmp;
                        QRes->ILUExists = Q1->ILUExists;
                        QRes->ILU = Q1->ILU;
                    }
                } else {
                    LASError(LASMemAllocErr, "Add_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                    if (QRes != NULL)
                        free(QRes);
                }
            
                if (QResName != NULL)
                    free(QResName);
            } else {
                LASError(LASMatrCombErr, "Add_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                QRes = NULL;
            }
        } else {
            LASError(LASDimErr, "Add_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
            QRes = NULL;
        }
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q1);
    Q_Unlock(Q2);

    return(QRes);
}